

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall pegmatite::Context::_parse_non_term(Context *this,Rule *r)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  ParserPosition b;
  ParserPosition local_78;
  value_type local_58;
  
  (**this->delegate->_vptr_ParserDelegate)(&local_58,this->delegate,r);
  if ((code *)local_58.source.start.it.idx == (code *)0x0) {
    peVar1 = (r->expr).super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Expr[2])(peVar1,this);
    cVar2 = (char)iVar3;
  }
  else {
    (*(code *)local_58.source.start.it.idx)(&local_58,&local_58,3);
    local_78.line = (this->position).line;
    local_78.col = (this->position).col;
    local_78.it.buffer._0_4_ = *(undefined4 *)&(this->position).it.buffer;
    local_78.it.buffer._4_4_ = *(undefined4 *)((long)&(this->position).it.buffer + 4);
    local_78.it.idx._0_4_ = (undefined4)(this->position).it.idx;
    local_78.it.idx._4_4_ = *(undefined4 *)((long)&(this->position).it.idx + 4);
    peVar1 = (r->expr).super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Expr[2])(peVar1,this);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      local_58.matched_rule = r;
      InputRange::InputRange(&local_58.source,&local_78,&this->position);
      std::
      vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::push_back(&this->matches,&local_58);
    }
  }
  return (bool)cVar2;
}

Assistant:

bool Context::_parse_non_term(const Rule &r)
{
	bool ok;
	if (get_parse_proc(r))
	{
		ParserPosition b = position;
		ok = r.expr->parse_non_term(*this);
		if (debug_parsing)
		{
			r.expr->dump();
			fprintf(stderr, "\n");
		}
		if (ok)
		{
			matches.push_back(ParseMatch(std::addressof(r), b, position));
		}
	}
	else
	{
		ok = r.expr->parse_non_term(*this);
	}
	return ok;
}